

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O2

void __thiscall TextBuffer::set_text(TextBuffer *this,u16string *new_text)

{
  Range old_range;
  u16string local_50;
  Point local_30;
  Point local_28;
  
  Point::Point(&local_30,0,0);
  local_28 = this->top_layer->extent_;
  std::__cxx11::u16string::u16string((u16string *)&local_50,new_text);
  old_range.end = local_28;
  old_range.start = local_30;
  set_text_in_range(this,old_range,&local_50);
  std::__cxx11::u16string::~u16string((u16string *)&local_50);
  return;
}

Assistant:

void TextBuffer::set_text(const u16string &new_text) {
  set_text_in_range(Range{Point(0, 0), extent()}, u16string(new_text));
}